

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgToken.cpp
# Opt level: O2

void __thiscall rsg::TokenStream::TokenStream(TokenStream *this)

{
  allocator_type local_9;
  
  std::vector<rsg::Token,_std::allocator<rsg::Token>_>::vector(&this->m_tokens,0x40,&local_9);
  this->m_numTokens = 0;
  return;
}

Assistant:

TokenStream::TokenStream (void)
	: m_tokens		(ALLOC_SIZE)
	, m_numTokens	(0)
{
}